

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

void __thiscall
OSSLEVPSymmetricAlgorithm::counterBitsInit
          (OSSLEVPSymmetricAlgorithm *this,ByteString *iv,size_t counterBits)

{
  int iVar1;
  BIGNUM *pBVar2;
  ulong w;
  long in_RDX;
  int n;
  long *in_RDI;
  BIGNUM *counter;
  ByteString *in_stack_ffffffffffffffc8;
  long local_18;
  
  BN_free((BIGNUM *)in_RDI[0xd]);
  in_RDI[0xd] = 0;
  BN_free((BIGNUM *)in_RDI[0xe]);
  in_RDI[0xe] = 0;
  if (in_RDX != 0) {
    pBVar2 = (BIGNUM *)OSSL::byteString2bn(in_stack_ffffffffffffffc8);
    BN_mask_bits(pBVar2,(int)in_RDX);
    local_18 = in_RDX;
    while (local_18 != 0) {
      local_18 = local_18 + -1;
      n = (int)local_18;
      iVar1 = BN_is_bit_set(pBVar2,n);
      if (iVar1 == 0) {
        BN_set_bit(pBVar2,n);
      }
      else {
        BN_clear_bit(pBVar2,n);
      }
    }
    BN_add_word(pBVar2,1);
    w = (**(code **)(*in_RDI + 0x68))();
    BN_mul_word(pBVar2,w);
    in_RDI[0xd] = (long)pBVar2;
    pBVar2 = BN_new();
    in_RDI[0xe] = (long)pBVar2;
    BN_zero_ex(in_RDI[0xe]);
  }
  return;
}

Assistant:

void OSSLEVPSymmetricAlgorithm::counterBitsInit(const ByteString& iv, size_t counterBits)
{
	BN_free(maximumBytes);
	maximumBytes = NULL;
	BN_free(counterBytes);
	counterBytes = NULL;

	// Check the counter bits
	if (counterBits > 0)
	{
		BIGNUM* counter = OSSL::byteString2bn(iv);
		BN_mask_bits(counter, counterBits);

		// Reverse the bits
		while (counterBits > 0)
		{
			counterBits--;
			if (BN_is_bit_set(counter, counterBits))
			{
				BN_clear_bit(counter, counterBits);
			}
			else
			{
				BN_set_bit(counter, counterBits);
			}
		}

		// Set the maximum bytes
		BN_add_word(counter, 1);
		BN_mul_word(counter, getBlockSize());
		maximumBytes = counter;
		counterBytes = BN_new();
		BN_zero(counterBytes);
	}
}